

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

void __thiscall lexer::Lexer::Lexer(Lexer *this,string *inp)

{
  pointer pcVar1;
  Word *pWVar2;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  Word local_390;
  Word local_340;
  Word local_2f0;
  Word local_2a0;
  Word local_250;
  Word local_200;
  Word local_1b0;
  Word local_160;
  Word local_110;
  Word local_c0;
  Word local_70;
  
  this->line = 1;
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  pcVar1 = (inp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->input,pcVar1,pcVar1 + inp->_M_string_length);
  this->readPosition = 0;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"true","");
  pWVar2 = &local_70;
  Word::Word(pWVar2,TRUE,&local_3b0);
  reserve((Lexer *)pWVar2,&local_70);
  Word::~Word(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"false","");
  pWVar2 = &local_c0;
  Word::Word(pWVar2,FALSE,&local_3d0);
  reserve((Lexer *)pWVar2,&local_c0);
  Word::~Word(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"define","");
  pWVar2 = &local_110;
  Word::Word(pWVar2,DEFINE,&local_3f0);
  reserve((Lexer *)pWVar2,&local_110);
  Word::~Word(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"declare","");
  pWVar2 = &local_160;
  Word::Word(pWVar2,DECLARE,&local_410);
  reserve((Lexer *)pWVar2,&local_160);
  Word::~Word(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"init","");
  pWVar2 = &local_1b0;
  Word::Word(pWVar2,INIT,&local_430);
  reserve((Lexer *)pWVar2,&local_1b0);
  Word::~Word(&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"if","");
  pWVar2 = &local_200;
  Word::Word(pWVar2,IF,&local_450);
  reserve((Lexer *)pWVar2,&local_200);
  Word::~Word(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"else","");
  pWVar2 = &local_250;
  Word::Word(pWVar2,ELSE,&local_470);
  reserve((Lexer *)pWVar2,&local_250);
  Word::~Word(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"for","");
  pWVar2 = &local_2a0;
  Word::Word(pWVar2,FOR,&local_490);
  reserve((Lexer *)pWVar2,&local_2a0);
  Word::~Word(&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"return","");
  pWVar2 = &local_2f0;
  Word::Word(pWVar2,RETURN,&local_4b0);
  reserve((Lexer *)pWVar2,&local_2f0);
  Word::~Word(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"in","");
  pWVar2 = &local_340;
  Word::Word(pWVar2,IN,&local_4d0);
  reserve((Lexer *)pWVar2,&local_340);
  Word::~Word(&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"null","");
  pWVar2 = &local_390;
  Word::Word(pWVar2,NULLTOKEN,&local_4f0);
  reserve((Lexer *)pWVar2,&local_390);
  Word::~Word(&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Lexer(std::string inp):input{inp},readPosition{0}{
        reserve(Word(TokenType::TRUE, "true"));
        reserve(Word(TokenType::FALSE, "false"));
        reserve(Word(TokenType::DEFINE, "define"));
        reserve(Word(TokenType::DECLARE, "declare"));
        reserve(Word(TokenType::INIT, "init"));
        reserve(Word(TokenType::IF, "if"));
        reserve(Word(TokenType::ELSE, "else"));
        reserve(Word(TokenType::FOR, "for"));
        reserve(Word(TokenType::RETURN, "return"));
        reserve(Word(TokenType::IN, "in"));
        reserve(Word(TokenType::NULLTOKEN, "null"));
    }